

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PostDecTestInt64(void)

{
  bool expected;
  long t;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  long lVar2;
  allocator local_51;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 0x10; lVar2 != 0x1a8; lVar2 = lVar2 + 0x18) {
    t = *(long *)(&UNK_0015b0d0 + lVar2);
    si.m_int = t;
    SVar1 = SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
            operator--(&si,0);
    expected = *(bool *)((long)&dec_int64 + lVar2);
    if ((SVar1.m_int == t) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case dec_int64 throw (2): ",&local_51);
      err_msg<long>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PostDecTestInt64()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_int64); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int64_t > si(dec_int64[i].x);
			SafeInt< std::int64_t > vv = si--;

			if(vv != dec_int64[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_int64[i].fExpected )
		{
			err_msg( "Error in case dec_int64 throw (2): ", dec_int64[i].x, dec_int64[i].fExpected );
		}
	}
}